

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f77_wrap3.c
# Opt level: O3

void Cffpknl(fitsfile *fptr,char *keyroot,int nstart,int nkeys,int *numval,char **comment,
            int *status)

{
  ulong uVar1;
  
  ffpknl(fptr,keyroot,nstart,nkeys,numval,comment,status);
  if (0 < nkeys) {
    uVar1 = 0;
    do {
      numval[uVar1] = (uint)(numval[uVar1] != 0);
      uVar1 = uVar1 + 1;
    } while ((uint)nkeys != uVar1);
  }
  return;
}

Assistant:

void Cffpknl( fitsfile *fptr, char *keyroot, int nstart, int nkeys,
              int *numval, char **comment, int *status )
{
   int i;
 
   for( i=0; i<nkeys; i++ )
      numval[i] = F2CLOGICAL(numval[i]);
   ffpknl( fptr, keyroot, nstart, nkeys, numval, comment, status );
   for( i=0; i<nkeys; i++ )
      numval[i] = C2FLOGICAL(numval[i]);
}